

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

void index_cat_helper(index_cat_info *info,index_stream *this)

{
  lzma_vli *plVar1;
  index_stream *this_00;
  index_stream *piVar2;
  
  do {
    this_00 = (index_stream *)(this->node).left;
    piVar2 = (index_stream *)(this->node).right;
    if (this_00 != (index_stream *)0x0) {
      index_cat_helper(info,this_00);
    }
    (this->node).uncompressed_base = (this->node).uncompressed_base + info->uncompressed_size;
    plVar1 = &(this->node).compressed_base;
    *plVar1 = *plVar1 + info->file_size;
    this->number = this->number + info->stream_number_add;
    this->block_number_base = this->block_number_base + info->block_number_add;
    index_tree_append(info->streams,&this->node);
    this = piVar2;
  } while (piVar2 != (index_stream *)0x0);
  return;
}

Assistant:

static void
index_cat_helper(const index_cat_info *info, index_stream *this)
{
	index_stream *left = (index_stream *)(this->node.left);
	index_stream *right = (index_stream *)(this->node.right);

	if (left != NULL)
		index_cat_helper(info, left);

	this->node.uncompressed_base += info->uncompressed_size;
	this->node.compressed_base += info->file_size;
	this->number += info->stream_number_add;
	this->block_number_base += info->block_number_add;
	index_tree_append(info->streams, &this->node);

	if (right != NULL)
		index_cat_helper(info, right);

	return;
}